

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.cpp
# Opt level: O0

uint8_t __thiscall GmmLib::GmmResourceInfoCommon::Is64KBPageSuitable(GmmResourceInfoCommon *this)

{
  int iVar1;
  uint32_t uVar2;
  undefined4 extraout_var;
  SKU_FEATURE_TABLE *pSVar3;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  GMM_GFX_SIZE_T Size;
  bool Ignore64KBPadding;
  GmmResourceInfoCommon *this_local;
  
  bVar8 = false;
  uVar4 = (this->Surf).Size + (this->AuxSurf).Size + (this->AuxSecSurf).Size;
  if ((((((ulong)(this->Surf).Flags.Info >> 5 & 1) == 0) &&
       (((ulong)(this->Surf).Flags.Info >> 0x28 & 1) == 0)) &&
      (((ulong)(this->Surf).Flags.Gpu & 1) == 0)) &&
     (((ulong)(this->Surf).Flags.Info >> 0xe & 1) == 0)) {
    if ((((ulong)(this->Surf).Flags.Gpu >> 0x18 & 1) != 0) &&
       (((ulong)(this->Surf).Flags.Gpu >> 0x19 & 1) == 0)) {
      iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
      pSVar3 = Context::GetSkuTable((Context *)CONCAT44(extraout_var,iVar1));
      if ((*(byte *)&pSVar3->field_5 >> 1 & 1) == 0) goto LAB_0026ebff;
    }
  }
  else {
LAB_0026ebff:
    bVar8 = true;
  }
  iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
  pSVar3 = Context::GetSkuTable((Context *)CONCAT44(extraout_var_00,iVar1));
  if (((ulong)pSVar3->field_1 >> 0x15 & 1) != 0) {
    bVar6 = false;
    if (((ulong)(this->Surf).Flags.Info >> 0x1f & 1) != 0) {
      bVar6 = ((ulong)(this->Surf).Flags.Info >> 0x17 & 1) == 0;
    }
    iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
    pSVar3 = Context::GetSkuTable((Context *)CONCAT44(extraout_var_01,iVar1));
    bVar7 = false;
    if (((ulong)pSVar3->field_1 >> 0x17 & 1) != 0) {
      bVar7 = ((ulong)(this->Surf).Flags.Info >> 0x15 & 1) != 0;
    }
    iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
    pSVar3 = Context::GetSkuTable((Context *)CONCAT44(extraout_var_02,iVar1));
    if ((((ulong)pSVar3->field_1 >> 0x17 & 1) != 0) ||
       (bVar5 = false, ((ulong)(this->Surf).Flags.Info & 0x1000000) != 0)) {
      iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
      uVar2 = Context::GetAllowedPaddingFor64KbPagesPercentage
                        ((Context *)CONCAT44(extraout_var_03,iVar1));
      bVar5 = (uVar4 * ((ulong)uVar2 + 100)) / 100 < (uVar4 + 0xffff) - (uVar4 + 0xffff & 0xffff);
    }
    bVar8 = ((bVar8 || bVar6) || bVar7) || bVar5;
    goto LAB_0026ee56;
  }
  if ((((ulong)(this->Surf).Flags.Info >> 0x15 & 1) == 0) || ((uVar4 & 0xffff) == 0)) {
    if (((ulong)(this->Surf).Flags.Info >> 0x15 & 1) != 0) goto LAB_0026ee56;
    iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
    uVar2 = Context::GetAllowedPaddingFor64KbPagesPercentage
                      ((Context *)CONCAT44(extraout_var_04,iVar1));
    if ((uVar4 + 0xffff) - (uVar4 + 0xffff & 0xffff) <= (uVar4 * ((ulong)uVar2 + 100)) / 100)
    goto LAB_0026ee56;
  }
  bVar8 = true;
LAB_0026ee56:
  iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
  pSVar3 = Context::GetSkuTable((Context *)CONCAT44(extraout_var_05,iVar1));
  if (((((ulong)pSVar3->field_1 >> 0x10 & 1) == 0) || (bVar8)) ||
     (((((this->Surf).Alignment.BaseAlignment & 0xffff) != 0 &&
       ((((this->Surf).Alignment.BaseAlignment != 0x8000 &&
         ((this->Surf).Alignment.BaseAlignment != 0x4000)) &&
        ((this->Surf).Alignment.BaseAlignment != 0x2000)))) &&
      ((this->Surf).Alignment.BaseAlignment != 0x1000)))) {
    this_local._7_1_ = '\0';
  }
  else {
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

uint8_t GMM_STDCALL GmmLib::GmmResourceInfoCommon::Is64KBPageSuitable()
{
    bool Ignore64KBPadding = false;
    //!!!! DO NOT USE GetSizeSurface() as it returns the padded size and not natural size.
    GMM_GFX_SIZE_T Size = Surf.Size + AuxSurf.Size + AuxSecSurf.Size;

    __GMM_ASSERT(Size);

    // All ESM resources and VirtuaPadding are exempt from 64KB paging
    if(Surf.Flags.Info.ExistingSysMem ||
       Surf.Flags.Info.XAdapter ||
       Surf.Flags.Gpu.CameraCapture ||
       Surf.Flags.Info.KernelModeMapped ||
       (Surf.Flags.Gpu.S3d && !Surf.Flags.Gpu.S3dDx &&
        !GetGmmLibContext()->GetSkuTable().FtrDisplayEngineS3d)
#if(LHDM)
       || (Surf.Flags.Info.AllowVirtualPadding &&
           ExistingSysMem.hParentAllocation)
#endif
       )
    {
        Ignore64KBPadding = true;
    }

    if(GetGmmLibContext()->GetSkuTable().FtrLocalMemory)
     {
        Ignore64KBPadding |= (Surf.Flags.Info.Shared && !Surf.Flags.Info.NotLockable);
        Ignore64KBPadding |= ((GetGmmLibContext()->GetSkuTable().FtrLocalMemoryAllows4KB) && Surf.Flags.Info.NoOptimizationPadding);
        Ignore64KBPadding |= ((GetGmmLibContext()->GetSkuTable().FtrLocalMemoryAllows4KB || Surf.Flags.Info.NonLocalOnly) && (((Size * (100 + (GMM_GFX_SIZE_T)GetGmmLibContext()->GetAllowedPaddingFor64KbPagesPercentage())) / 100) < GFX_ALIGN(Size, GMM_KBYTE(64))));
    }
    else
    {
        // The final padded size cannot be larger then a set percentage of the original size
        if((Surf.Flags.Info.NoOptimizationPadding && !GFX_IS_ALIGNED(Size, GMM_KBYTE(64))) /*Surface is not 64kb aligned*/ ||
           (!Surf.Flags.Info.NoOptimizationPadding && (((Size * (100 + (GMM_GFX_SIZE_T)GetGmmLibContext()->GetAllowedPaddingFor64KbPagesPercentage())) / 100) < GFX_ALIGN(Size, GMM_KBYTE(64)))) /*10% padding TBC */)
        {
            Ignore64KBPadding |= true;
        }
    }

    // If 64KB paging is enabled pad out the resource to 64KB alignment
    if(GetGmmLibContext()->GetSkuTable().FtrWddm2_1_64kbPages &&
       // Ignore the padding for the above VirtualPadding or ESM cases
       (!Ignore64KBPadding) &&
       // Resource must be 64KB aligned
       (GFX_IS_ALIGNED(Surf.Alignment.BaseAlignment, GMM_KBYTE(64)) ||
        // Or must be aligned to a factor of 64KB
        (Surf.Alignment.BaseAlignment == GMM_KBYTE(32)) ||
        (Surf.Alignment.BaseAlignment == GMM_KBYTE(16)) ||
        (Surf.Alignment.BaseAlignment == GMM_KBYTE(8)) ||
        (Surf.Alignment.BaseAlignment == GMM_KBYTE(4))))
    {
        return 1;
    }

    return 0;
}